

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O1

bool __thiscall
Gluco::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Gluco::Lit> *out_clause)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_RAX;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  Clause *pCVar8;
  undefined8 local_38;
  
  this->merges = this->merges + 1;
  if (out_clause->data != (Lit *)0x0) {
    out_clause->sz = 0;
  }
  pCVar8 = _qs;
  if (*(int *)&(_ps->header).field_0x4 < *(int *)&(_qs->header).field_0x4) {
    pCVar8 = _ps;
    _ps = _qs;
  }
  iVar1 = *(int *)&(pCVar8->header).field_0x4;
  bVar7 = iVar1 < 1;
  local_38 = in_RAX;
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      uVar2 = *(uint *)(&pCVar8[1].header.field_0x0 + lVar6 * 4);
      if ((int)uVar2 >> 1 != v) {
        if (0 < (int)(*(ulong *)&_ps->header >> 0x20)) {
          uVar5 = 0;
          do {
            uVar3 = *(uint *)(&_ps[1].header.field_0x0 + uVar5 * 4);
            if ((int)uVar3 >> 1 == (int)uVar2 >> 1) {
              if ((uVar3 ^ uVar2) == 1) {
                return bVar7;
              }
              goto LAB_005c40f5;
            }
            uVar5 = uVar5 + 1;
          } while (*(ulong *)&_ps->header >> 0x20 != uVar5);
        }
        local_38 = CONCAT44(uVar2,local_38._0_4_);
        vec<Gluco::Lit>::push(out_clause,(Lit *)((long)&local_38 + 4));
      }
LAB_005c40f5:
      lVar6 = lVar6 + 1;
      lVar4 = (long)*(int *)&(pCVar8->header).field_0x4;
      bVar7 = lVar4 <= lVar6;
    } while (lVar6 < lVar4);
  }
  if (0 < *(int *)&(_ps->header).field_0x4) {
    lVar6 = 0;
    do {
      iVar1 = *(int *)(&_ps[1].header.field_0x0 + lVar6 * 4);
      if (iVar1 >> 1 != v) {
        local_38 = CONCAT44(local_38._4_4_,iVar1);
        vec<Gluco::Lit>::push(out_clause,(Lit *)&local_38);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)&(_ps->header).field_0x4);
  }
  return bVar7;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    int i, j;
    for (i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i])) {
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
                }
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}